

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  size_t sVar1;
  holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar2;
  
  if ((this->mOffset == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *)
             operator_new(0x20);
  }
  else {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 - 1;
    phVar2 = this->mPool[sVar1 - 1];
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0024aff8;
  (phVar2->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&phVar2->mDat;
  (phVar2->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&phVar2->mDat;
  (phVar2->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl._M_node.
  _M_size = 0;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}